

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr_wrapper.hpp
# Opt level: O0

uint attr_wrapper::get_attribute<unsigned_int>(Value *doc,char *name)

{
  ConstMemberIterator CVar1;
  bool bVar2;
  uint uVar3;
  Pointer pGVar4;
  Type_error *__return_storage_ptr__;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_20;
  ConstMemberIterator loc;
  char *name_local;
  Value *doc_local;
  
  loc.ptr_ = (Pointer)name;
  local_20.ptr_ = (Pointer)get_loc(doc,name);
  pGVar4 = rapidjson::
           GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::operator->(&local_20);
  bVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsUint(&pGVar4->value);
  if (!bVar2) {
    __return_storage_ptr__ = (Type_error *)__cxa_allocate_exception(0x10);
    CVar1 = loc;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,(char *)CVar1.ptr_,&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"n unsigned integer.",&local_79);
    genTypeError(__return_storage_ptr__,(string *)local_40,(string *)local_78);
    __cxa_throw(__return_storage_ptr__,&Type_error::typeinfo,Type_error::~Type_error);
  }
  pGVar4 = rapidjson::
           GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::operator->(&local_20);
  uVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(&pGVar4->value);
  return uVar3;
}

Assistant:

inline unsigned get_attribute<unsigned>(const rapidjson::Value& doc,
                                           const char* name)
   {
      auto loc = get_loc(doc, name);
      if(!loc->value.IsUint())
      {
         throw genTypeError(name, "n unsigned integer.");
      }
      return loc->value.GetUint();
   }